

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlChar * xmlEscapeText(xmlChar *text,int flags)

{
  byte bVar1;
  int iVar2;
  xmlChar *pxVar3;
  int local_a4;
  int newSize;
  xmlChar *tmp;
  int val;
  int c;
  int chunkSize;
  size_t totalSize;
  size_t unescapedSize;
  size_t replSize;
  size_t used;
  xmlChar *repl;
  xmlChar *end;
  char buf [12];
  size_t size;
  xmlChar *unescaped;
  xmlChar *out;
  xmlChar *buffer;
  xmlChar *cur;
  int flags_local;
  xmlChar *text_local;
  
  buf[4] = '2';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  unescaped = (xmlChar *)(*xmlMalloc)(0x33);
  size = (size_t)text;
  out = unescaped;
  buffer = text;
  if (unescaped == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
LAB_00132a7e:
  if (*buffer == '\0') {
    *unescaped = '\0';
    return out;
  }
  val = 1;
  do {
    bVar1 = *buffer;
    if (bVar1 < 0x80) {
      if (""[*buffer] == '\0') break;
    }
    else if ((flags & 2U) != 0) break;
    buffer = buffer + 1;
  } while( true );
  if (bVar1 == 0) {
    val = 0;
    used = (long)"\x01" + 1;
    unescapedSize = 0;
    goto LAB_00132e67;
  }
  if (bVar1 == 0x3c) {
    if ((((((flags & 4U) == 0) || ((flags & 1U) == 0)) || (buffer[1] != '!')) ||
        ((buffer[2] != '-' || (buffer[3] != '-')))) ||
       (repl = xmlStrstr(buffer,"-->"), repl == (xmlChar *)0x0)) {
      used = (size_t)anon_var_dwarf_69cb;
      unescapedSize = 4;
    }
    else {
      val = ((int)repl - (int)buffer) + 3;
      used = (size_t)buffer;
      unescapedSize = (size_t)val;
    }
    goto LAB_00132e67;
  }
  if (bVar1 == 0x3e) {
    used = (size_t)anon_var_dwarf_69d6;
    unescapedSize = 4;
    goto LAB_00132e67;
  }
  if (bVar1 == 0x26) {
    if ((((flags & 4U) == 0) || ((flags & 1U) == 0)) ||
       ((buffer[1] != '{' || (repl = xmlStrchr(buffer,'}'), repl == (xmlChar *)0x0)))) {
      used = (size_t)anon_var_dwarf_69e1;
      unescapedSize = 5;
    }
    else {
      val = ((int)repl - (int)buffer) + 1;
      used = (size_t)buffer;
      unescapedSize = (size_t)val;
    }
    goto LAB_00132e67;
  }
  if (((flags & 8U) != 0) && (bVar1 == 0x22)) {
    used = (size_t)anon_var_dwarf_47;
    unescapedSize = 6;
    goto LAB_00132e67;
  }
  if (((flags & 4U) == 0) && (bVar1 == 0xd)) {
    used = (size_t)anon_var_dwarf_6a0f;
    unescapedSize = 5;
    goto LAB_00132e67;
  }
  if (((flags & 2U) == 0) || (bVar1 < 0x80)) {
    if ((((flags & 0x14U) != 0) || (((0x1f < bVar1 || (bVar1 == 10)) || (bVar1 == 9)))) ||
       (bVar1 == 0xd)) {
      buffer = buffer + 1;
      if (*buffer != '\0') goto LAB_00132a7e;
      val = 0;
    }
    used = (long)"\x01" + 1;
    unescapedSize = 0;
    goto LAB_00132e67;
  }
  val = 4;
  tmp._4_4_ = xmlGetUTF8Char(buffer,&val);
  if (tmp._4_4_ < 0) {
    tmp._4_4_ = 0xfffd;
    val = 1;
  }
  else if ((flags & 0x10U) == 0) {
    if (tmp._4_4_ < 0x100) {
      if (((tmp._4_4_ < 9) || (10 < tmp._4_4_)) && ((tmp._4_4_ != 0xd && (tmp._4_4_ < 0x20)))) {
LAB_00132dad:
        tmp._4_4_ = 0xfffd;
      }
    }
    else if ((((tmp._4_4_ < 0x100) || (0xd7ff < tmp._4_4_)) &&
             ((tmp._4_4_ < 0xe000 || (0xfffd < tmp._4_4_)))) &&
            ((tmp._4_4_ < 0x10000 || (0x10ffff < tmp._4_4_)))) goto LAB_00132dad;
  }
  iVar2 = xmlSerializeHexCharRef((char *)((long)&end + 4),tmp._4_4_);
  unescapedSize = (size_t)iVar2;
  used = (long)&end + 4;
LAB_00132e67:
  replSize = (long)unescaped - (long)out;
  totalSize = (long)buffer - size;
  _c = totalSize + unescapedSize;
  buffer = buffer + val;
  if (buf._4_8_ - replSize < _c) {
    if ((0x7fffffffffffffff < (ulong)buf._4_8_) || (0x7fffffffffffffff - buf._4_8_ < _c)) {
      (*xmlFree)(out);
      return (xmlChar *)0x0;
    }
    local_a4 = (int)buf._4_8_ + (int)_c;
    if (*buffer != '\0') {
      local_a4 = local_a4 * 2;
    }
    pxVar3 = (xmlChar *)(*xmlRealloc)(out,(long)(local_a4 + 1));
    if (pxVar3 == (xmlChar *)0x0) {
      (*xmlFree)(out);
      return (xmlChar *)0x0;
    }
    buf._4_8_ = SEXT48(local_a4);
    unescaped = pxVar3 + replSize;
    out = pxVar3;
  }
  memcpy(unescaped,(void *)size,totalSize);
  pxVar3 = unescaped + totalSize;
  memcpy(pxVar3,(void *)used,unescapedSize);
  unescaped = pxVar3 + unescapedSize;
  size = (size_t)buffer;
  goto LAB_00132a7e;
}

Assistant:

xmlChar *
xmlEscapeText(const xmlChar *text, int flags) {
    const xmlChar *cur;
    xmlChar *buffer;
    xmlChar *out;
    const xmlChar *unescaped;
    size_t size = 50;

    buffer = xmlMalloc(size + 1);
    if (buffer == NULL)
        return(NULL);
    out = buffer;

    cur = text;
    unescaped = cur;

    while (*cur != '\0') {
        char buf[12];
	const xmlChar *end;
        const xmlChar *repl;
        size_t used;
        size_t replSize;
        size_t unescapedSize;
        size_t totalSize;
        int chunkSize = 1;
        int c;

        /* accelerator */
	while (1) {
            c = *cur;

            if (c < 0x80) {
                if (!xmlEscapeSafe[*cur])
                    break;
            } else {
               if (flags & XML_ESCAPE_NON_ASCII)
                   break;
            }
            cur += 1;
        }

        if (c == 0) {
            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
        } else if (c == '<') {
	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
                chunkSize = (end - cur) + 3;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&lt;";
                replSize = 4;
            }
	} else if (c == '>') {
            repl = BAD_CAST "&gt;";
            replSize = 4;
	} else if (c == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
                (cur[1] == '{') && (end = xmlStrchr(cur, '}'))) {
                chunkSize = (end - cur) + 1;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&amp;";
                replSize = 5;
            }
	} else if ((flags & XML_ESCAPE_QUOT) && (c == '"')) {
            repl = BAD_CAST "&quot;";
            replSize = 6;
	} else if (((flags & XML_ESCAPE_HTML) == 0) && (c == '\r')) {
	    repl = BAD_CAST "&#13;";
            replSize = 5;
	} else if ((flags & XML_ESCAPE_NON_ASCII) && (c >= 0x80)) {
            int val;

            chunkSize = 4;
            val = xmlGetUTF8Char(cur, &chunkSize);
            if (val < 0) {
                val = 0xFFFD;
                chunkSize = 1;
            } else if (((flags & XML_ESCAPE_ALLOW_INVALID) == 0) &&
                       (!IS_CHAR(val))) {
                val = 0xFFFD;
            }

            replSize = xmlSerializeHexCharRef(buf, val);
            repl = BAD_CAST buf;
	} else if ((flags & (XML_ESCAPE_ALLOW_INVALID | XML_ESCAPE_HTML)) ||
                   (c >= 0x20) ||
	           (c == '\n') || (c == '\t') || (c == '\r')) {
	    /* default case, just copy */
            cur += 1;
            if (*cur != 0)
                continue;

            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
	} else {
            /* ignore */
            repl = BAD_CAST "";
            replSize = 0;
        }

        used = out - buffer;
        unescapedSize = cur - unescaped;
        totalSize = unescapedSize + replSize;

	cur += chunkSize;

        if (totalSize > size - used) {
            xmlChar *tmp;
            int newSize;

            if ((size > (SIZE_MAX - 1) / 2) ||
                (totalSize > (SIZE_MAX - 1) / 2 - size)) {
                xmlFree(buffer);
                return(NULL);
            }
            newSize = size + totalSize;
            if (*cur != 0)
                newSize *= 2;
            tmp = xmlRealloc(buffer, newSize + 1);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            size = newSize;
            out = buffer + used;
        }

        memcpy(out, unescaped, unescapedSize);
        out += unescapedSize;
        memcpy(out, repl, replSize);
        out += replSize;

        unescaped = cur;
    }

    *out = 0;
    return(buffer);
}